

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

QPlatformMenu * __thiscall
QMenuBarPrivate::findInsertionPlatformMenu(QMenuBarPrivate *this,QAction *action)

{
  long lVar1;
  long *plVar2;
  QWidget *this_00;
  bool bVar3;
  QPlatformMenu *pQVar4;
  long lVar5;
  int iVar6;
  QList<QAction_*> *__return_storage_ptr__;
  long in_FS_OFFSET;
  QList<QAction_*> local_68;
  QList<QAction_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  __return_storage_ptr__ = &local_50;
  QWidget::actions(__return_storage_ptr__,this_00);
  if (local_50.d.size != 0) {
    lVar5 = -8;
    do {
      iVar6 = (int)__return_storage_ptr__;
      lVar1 = local_50.d.size * -8 + lVar5;
      if (lVar1 == -8) goto LAB_0046f1cb;
      __return_storage_ptr__ = (QList<QAction_*> *)(lVar5 + 8);
      plVar2 = (long *)((long)(local_50.d.ptr + 1) + lVar5);
      lVar5 = (long)__return_storage_ptr__;
    } while ((QAction *)*plVar2 != action);
    iVar6 = (int)((long)__return_storage_ptr__ >> 3);
LAB_0046f1cb:
    if (lVar1 != -8) goto LAB_0046f1d8;
  }
  iVar6 = -1;
LAB_0046f1d8:
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
    }
  }
  lVar5 = (long)iVar6;
  pQVar4 = (QPlatformMenu *)0x0;
  while( true ) {
    lVar5 = lVar5 + 1;
    if (pQVar4 == (QPlatformMenu *)0x0) {
      QWidget::actions(&local_50,this_00);
      bVar3 = lVar5 < local_50.d.size;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) break;
    QWidget::actions(&local_68,this_00);
    pQVar4 = getPlatformMenu(this,local_68.d.ptr[lVar5]);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformMenu *QMenuBarPrivate::findInsertionPlatformMenu(const QAction *action)
{
    Q_Q(QMenuBar);
    QPlatformMenu *beforeMenu = nullptr;
    for (int beforeIndex = indexOf(const_cast<QAction *>(action)) + 1;
         !beforeMenu && (beforeIndex < q->actions().size());
         ++beforeIndex) {
        beforeMenu = getPlatformMenu(q->actions().at(beforeIndex));
    }

    return beforeMenu;
}